

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O2

void writeErrors(string *description,vector<CError,_std::allocator<CError>_> *errors)

{
  pointer pCVar1;
  ostream *poVar2;
  string *psVar3;
  pointer pCVar4;
  CError error;
  PositionInfo local_90;
  string local_80;
  CError local_60;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)description);
  std::operator<<(poVar2,"\n");
  pCVar1 = (errors->super__Vector_base<CError,_std::allocator<CError>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar4 = (errors->super__Vector_base<CError,_std::allocator<CError>_>)._M_impl.
                super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
    CError::CError(&local_60,pCVar4);
    local_90 = CError::GetPosition(&local_60);
    PositionInfo::GetStringPosition_abi_cxx11_(&local_80,&local_90);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_80);
    poVar2 = std::operator<<(poVar2," ");
    psVar3 = CError::GetMessage_abi_cxx11_(&local_60);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void writeErrors( const std::string &description, const std::vector<CError> &errors ) {
    std::cout << description << "\n";

    for ( auto error : errors ) {
        std::cout << error.GetPosition( ).GetStringPosition( ) << " " << error.GetMessage( ) << "\n";
    }
}